

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3GenerateRowIndexDelete
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx,int iIdxNoSeek)

{
  Index **ppIVar1;
  Vdbe *p;
  int regPrior;
  Index *pPrior;
  Index *pIVar2;
  int *piVar3;
  Index *pIdx;
  int iPartIdxLabel;
  int *local_48;
  Parse *local_40;
  Vdbe *local_38;
  
  p = pParse->pVdbe;
  pIdx = pTab->pIndex;
  if ((pTab->tabFlags & 0x80) != 0) {
    pIVar2 = pIdx;
    if (pIdx == (Index *)0x0) {
      return;
    }
    do {
      if ((*(ushort *)&pIVar2->field_0x63 & 3) == 2) goto LAB_001ad6f7;
      ppIVar1 = &pIVar2->pNext;
      pIVar2 = *ppIVar1;
    } while (*ppIVar1 != (Index *)0x0);
  }
  pIVar2 = (Index *)0x0;
LAB_001ad6f7:
  if (pIdx != (Index *)0x0) {
    regPrior = -1;
    pPrior = (Index *)0x0;
    piVar3 = aRegIdx;
    local_48 = aRegIdx;
    local_40 = pParse;
    local_38 = p;
    do {
      if (aRegIdx == (int *)0x0) {
        if (pIdx != pIVar2) goto LAB_001ad73c;
      }
      else if ((pIdx != pIVar2) && (*piVar3 != 0)) {
LAB_001ad73c:
        if (iIdxNoSeek != iIdxCur) {
          regPrior = sqlite3GenerateIndexKey
                               (local_40,pIdx,iDataCur,0,1,&iPartIdxLabel,pPrior,regPrior);
          sqlite3VdbeAddOp3(p,0x8c,iIdxCur,regPrior,
                            (uint)(&pIdx->nKeyCol)[(*(ushort *)&pIdx->field_0x63 & 8) == 0]);
          if (0 < (long)p->nOp) {
            p->aOp[(long)p->nOp + -1].p5 = 1;
          }
          pPrior = pIdx;
          aRegIdx = local_48;
          if (iPartIdxLabel != 0) {
            sqlite3VdbeResolveLabel(local_40->pVdbe,iPartIdxLabel);
            aRegIdx = local_48;
          }
        }
      }
      pIdx = pIdx->pNext;
      iIdxCur = iIdxCur + 1;
      piVar3 = piVar3 + 1;
    } while (pIdx != (Index *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx,      /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
  int iIdxNoSeek     /* Do not delete from this cursor */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    if( iIdxCur+i==iIdxNoSeek ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
        &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
        pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3VdbeChangeP5(v, 1);  /* Cause IdxDelete to error if no entry found */
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}